

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode ExtensionObject_decodeBinary(UA_ExtensionObject *dst,UA_DataType *_)

{
  UA_Byte *pUVar1;
  UA_StatusCode UVar2;
  void *pvVar3;
  UA_Byte UVar4;
  ulong uVar5;
  uint uVar6;
  UA_StatusCode UVar7;
  long lVar8;
  undefined8 local_48;
  anon_union_16_4_621dfe33_for_identifier aStack_40;
  
  local_48 = (UA_DataType *)0x0;
  aStack_40.string.length = 0;
  aStack_40.string.data = (UA_Byte *)0x0;
  UVar2 = NodeId_decodeBinary((UA_NodeId *)&local_48,_);
  uVar6 = 0;
  if (end < pos + 1) {
    UVar4 = '\0';
    uVar6 = 0x80070000;
  }
  else {
    UVar4 = *pos;
    pos = pos + 1;
  }
  pUVar1 = pos;
  UVar7 = 0x80070000;
  if (local_48._4_4_ == UA_NODEIDTYPE_NUMERIC) {
    UVar7 = uVar6 | UVar2;
  }
  if (UVar7 == 0) {
    if (UVar4 != '\0') {
      if (UVar4 == '\x02') {
        dst->encoding = UA_EXTENSIONOBJECT_ENCODED_XML;
      }
      else {
        if (UVar4 != '\x01') {
          return 0x80070000;
        }
        lVar8 = 0;
        do {
          if (aStack_40.numeric == *(ushort *)((long)&UA_TYPES[0].binaryEncodingId + lVar8)) {
            pvVar3 = calloc(1,(ulong)*(ushort *)((long)&UA_TYPES[0].memSize + lVar8));
            (dst->content).decoded.data = pvVar3;
            if (pvVar3 == (void *)0x0) {
              return 0x80030000;
            }
            pos = pUVar1 + 4;
            dst->encoding = UA_EXTENSIONOBJECT_DECODED;
            (dst->content).decoded.type = (UA_DataType *)((long)&UA_TYPES[0].typeName + lVar8);
            uVar5 = 0x19;
            if (((&UA_TYPES[0].field_0x25)[lVar8] & 1) != 0) {
              uVar5 = (ulong)*(ushort *)((long)&UA_TYPES[0].typeIndex + lVar8);
            }
            UVar2 = (*(code *)(&decodeBinaryJumpTable)[uVar5])(pvVar3);
            return UVar2;
          }
          lVar8 = lVar8 + 0x30;
        } while (lVar8 != 0x1e90);
        dst->encoding = UA_EXTENSIONOBJECT_ENCODED_BYTESTRING;
      }
      (dst->content).decoded.type = local_48;
      (dst->content).decoded.data = (void *)aStack_40.string.length;
      *(UA_Byte **)((long)&dst->content + 0x10) = aStack_40.string.data;
      UVar2 = Array_decodeBinary((void **)((long)&dst->content + 0x20),
                                 (size_t *)((long)&dst->content + 0x18),UA_TYPES + 2);
      return UVar2;
    }
    dst->encoding = UA_EXTENSIONOBJECT_ENCODED_NOBODY;
    (dst->content).decoded.type = local_48;
    (dst->content).decoded.data = (void *)aStack_40.string.length;
    *(UA_Byte **)((long)&dst->content + 0x10) = aStack_40.string.data;
    (dst->content).encoded.body.length = 0;
    (dst->content).encoded.body.data = (UA_Byte *)0x0;
    UVar7 = 0;
  }
  else {
    deleteMembers_noInit(&local_48,UA_TYPES + 0x10);
  }
  return UVar7;
}

Assistant:

static UA_StatusCode
ExtensionObject_decodeBinary(UA_ExtensionObject *dst, const UA_DataType *_) {
    UA_Byte encoding = 0;
    UA_NodeId typeId;
    UA_NodeId_init(&typeId);
    UA_StatusCode retval = NodeId_decodeBinary(&typeId, NULL);
    retval |= Byte_decodeBinary(&encoding, NULL);
    if(typeId.identifierType != UA_NODEIDTYPE_NUMERIC)
        retval = UA_STATUSCODE_BADDECODINGERROR;
    if(retval != UA_STATUSCODE_GOOD) {
        UA_NodeId_deleteMembers(&typeId);
        return retval;
    }

    if(encoding == UA_EXTENSIONOBJECT_ENCODED_BYTESTRING) {
        retval = ExtensionObject_decodeBinaryContent(dst, &typeId);
    } else if(encoding == UA_EXTENSIONOBJECT_ENCODED_NOBODY) {
        dst->encoding = (UA_ExtensionObjectEncoding)encoding;
        dst->content.encoded.typeId = typeId;
        dst->content.encoded.body = UA_BYTESTRING_NULL;
    } else if(encoding == UA_EXTENSIONOBJECT_ENCODED_XML) {
        dst->encoding = (UA_ExtensionObjectEncoding)encoding;
        dst->content.encoded.typeId = typeId;
        retval = ByteString_decodeBinary(&dst->content.encoded.body);
    } else {
        retval = UA_STATUSCODE_BADDECODINGERROR;
    }
    return retval;
}